

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_meshb_cell_bcast
          (REF_CELL ref_cell,REF_GLOB ncell,REF_NODE ref_node,REF_INT version,FILE *file)

{
  bool bVar1;
  uint uVar2;
  size_t __n;
  size_t sVar3;
  long lVar4;
  bool local_13d;
  int local_13c;
  int local_138;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  size_t nread;
  REF_INT nodes [27];
  REF_BOOL one_node_local;
  REF_BOOL have_all_nodes;
  REF_INT new_cell;
  REF_INT local;
  REF_INT node;
  REF_INT cell;
  REF_INT size_per;
  REF_INT node_per;
  REF_LONG *c2n_long;
  REF_INT *c2n_int;
  REF_GLOB *c2n;
  REF_INT section_size;
  REF_INT chunk;
  REF_GLOB ncell_read;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_NODE pRStack_28;
  REF_INT version_local;
  REF_NODE ref_node_local;
  REF_GLOB ncell_local;
  REF_CELL ref_cell_local;
  
  ncell_read = (REF_GLOB)ref_node->ref_mpi;
  if (ncell / (long)((REF_MPI)ncell_read)->n < 1000000) {
    local_138 = 1000000;
  }
  else {
    local_138 = (int)(ncell / (long)((REF_MPI)ncell_read)->n);
  }
  c2n._4_4_ = local_138;
  node = ref_cell->size_per;
  cell = ref_cell->node_per;
  ref_mpi = (REF_MPI)file;
  file_local._4_4_ = version;
  pRStack_28 = ref_node;
  ref_node_local = (REF_NODE)ncell;
  ncell_local = (REF_GLOB)ref_cell;
  if (node * local_138 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x275,
           "ref_part_meshb_cell_bcast","malloc c2n of REF_GLOB negative");
    ref_cell_local._4_4_ = 1;
  }
  else {
    c2n_int = (REF_INT *)malloc((long)(node * local_138) << 3);
    if (c2n_int == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x275,
             "ref_part_meshb_cell_bcast","malloc c2n of REF_GLOB NULL");
      ref_cell_local._4_4_ = 2;
    }
    else if ((cell + 1) * c2n._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x276,
             "ref_part_meshb_cell_bcast","malloc c2n_int of REF_INT negative");
      ref_cell_local._4_4_ = 1;
    }
    else {
      c2n_long = (REF_LONG *)malloc((long)((cell + 1) * c2n._4_4_) << 2);
      if (c2n_long == (REF_LONG *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x276,"ref_part_meshb_cell_bcast","malloc c2n_int of REF_INT NULL");
        ref_cell_local._4_4_ = 2;
      }
      else if ((cell + 1) * c2n._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x277,"ref_part_meshb_cell_bcast","malloc c2n_long of REF_LONG negative");
        ref_cell_local._4_4_ = 1;
      }
      else {
        _size_per = malloc((long)((cell + 1) * c2n._4_4_) << 3);
        if (_size_per == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x277,"ref_part_meshb_cell_bcast","malloc c2n_long of REF_LONG NULL");
          ref_cell_local._4_4_ = 2;
        }
        else {
          for (_section_size = 0; _section_size < (long)ref_node_local;
              _section_size = (int)c2n + _section_size) {
            if (c2n._4_4_ < (int)ref_node_local - (int)_section_size) {
              local_13c = c2n._4_4_;
            }
            else {
              local_13c = (int)ref_node_local - (int)_section_size;
            }
            c2n._0_4_ = local_13c;
            if (*(int *)(ncell_read + 4) == 0) {
              __n = (size_t)(local_13c * (cell + 1));
              if (file_local._4_4_ < 4) {
                sVar3 = fread(c2n_long,4,__n,(FILE *)ref_mpi);
                if (__n != sVar3) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x27f,"ref_part_meshb_cell_bcast","int c2n",__n,sVar3);
                  return 1;
                }
                for (local = 0; local < (int)c2n; local = local + 1) {
                  for (new_cell = 0; new_cell < node; new_cell = new_cell + 1) {
                    *(long *)(c2n_int + (long)(new_cell + node * local) * 2) =
                         (long)*(int *)((long)c2n_long + (long)(new_cell + (cell + 1) * local) * 4);
                  }
                }
              }
              else {
                sVar3 = fread(_size_per,8,__n,(FILE *)ref_mpi);
                if (__n != sVar3) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x285,"ref_part_meshb_cell_bcast","long c2n",__n,sVar3);
                  return 1;
                }
                for (local = 0; local < (int)c2n; local = local + 1) {
                  for (new_cell = 0; new_cell < node; new_cell = new_cell + 1) {
                    *(undefined8 *)(c2n_int + (long)(new_cell + node * local) * 2) =
                         *(undefined8 *)
                          ((long)_size_per + (long)(new_cell + (cell + 1) * local) * 8);
                  }
                }
              }
              for (local = 0; local < (int)c2n; local = local + 1) {
                for (new_cell = 0; new_cell < cell; new_cell = new_cell + 1) {
                  lVar4 = (long)(new_cell + node * local);
                  *(long *)(c2n_int + lVar4 * 2) = *(long *)(c2n_int + lVar4 * 2) + -1;
                }
              }
            }
            uVar2 = ref_mpi_bcast((REF_MPI)ncell_read,c2n_int,node * (int)c2n,2);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x28f,"ref_part_meshb_cell_bcast",(ulong)uVar2,"broadcast read c2n");
              return uVar2;
            }
            for (local = 0; local < (int)c2n; local = local + 1) {
              bVar1 = true;
              for (new_cell = 0; new_cell < cell; new_cell = new_cell + 1) {
                uVar2 = ::ref_node_local(pRStack_28,
                                         *(REF_GLOB *)
                                          (c2n_int + (long)(new_cell + node * local) * 2),
                                         &have_all_nodes);
                if ((uVar2 != 0) && (uVar2 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x296,"ref_part_meshb_cell_bcast",(ulong)uVar2,"local");
                  return uVar2;
                }
                if (have_all_nodes == -1) {
                  bVar1 = false;
                  break;
                }
                nodes[(long)new_cell + -2] = have_all_nodes;
              }
              if (bVar1) {
                if (cell != node) {
                  nodes[(long)cell + -2] =
                       (REF_INT)*(undefined8 *)(c2n_int + (long)(cell + node * local) * 2);
                }
                nodes[0x1a] = 0;
                for (new_cell = 0; new_cell < cell; new_cell = new_cell + 1) {
                  local_13d = true;
                  if (nodes[0x1a] == 0) {
                    local_13d = pRStack_28->ref_mpi->id ==
                                pRStack_28->part[nodes[(long)new_cell + -2]];
                  }
                  nodes[0x1a] = (uint)local_13d;
                }
                if ((nodes[0x1a] != 0) &&
                   (uVar2 = ref_cell_add((REF_CELL)ncell_local,(REF_INT *)&nread,&one_node_local),
                   uVar2 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x2a7,"ref_part_meshb_cell_bcast",(ulong)uVar2,"add");
                  return uVar2;
                }
              }
            }
          }
          free(_size_per);
          free(c2n_long);
          free(c2n_int);
          ref_cell_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_cell_bcast(REF_CELL ref_cell,
                                                    REF_GLOB ncell,
                                                    REF_NODE ref_node,
                                                    REF_INT version,
                                                    FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_GLOB ncell_read;
  REF_INT chunk;
  REF_INT section_size;
  REF_GLOB *c2n;
  REF_INT *c2n_int;
  REF_LONG *c2n_long;
  REF_INT node_per, size_per;
  REF_INT cell, node, local, new_cell;
  REF_BOOL have_all_nodes, one_node_local;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  size_t nread;

  chunk = (REF_INT)MAX(1000000, ncell / (REF_LONG)ref_mpi_n(ref_mpi));

  size_per = ref_cell_size_per(ref_cell);
  node_per = ref_cell_node_per(ref_cell);

  ref_malloc(c2n, size_per * chunk, REF_GLOB);
  ref_malloc(c2n_int, (1 + node_per) * chunk, REF_INT);
  ref_malloc(c2n_long, (1 + node_per) * chunk, REF_LONG);

  ncell_read = 0;
  while (ncell_read < ncell) {
    section_size = MIN(chunk, (REF_INT)(ncell - ncell_read));
    if (ref_mpi_once(ref_mpi)) {
      nread = (size_t)(section_size * (1 + node_per));
      if (version < 4) {
        REIS(nread, fread(c2n_int, sizeof(REF_INT), nread, file), "int c2n");
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
      } else {
        REIS(nread, fread(c2n_long, sizeof(REF_LONG), nread, file), "long c2n");
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_long[node + (node_per + 1) * cell];
      }
      for (cell = 0; cell < section_size; cell++)
        for (node = 0; node < node_per; node++) c2n[node + size_per * cell]--;
    }
    RSS(ref_mpi_bcast(ref_mpi, c2n, size_per * section_size, REF_GLOB_TYPE),
        "broadcast read c2n");

    /* convert to local nodes and add if local */
    for (cell = 0; cell < section_size; cell++) {
      have_all_nodes = REF_TRUE;
      for (node = 0; node < node_per; node++) {
        RXS(ref_node_local(ref_node, c2n[node + size_per * cell], &local),
            REF_NOT_FOUND, "local");
        if (REF_EMPTY != local) {
          nodes[node] = local;
        } else {
          have_all_nodes = REF_FALSE;
          break;
        }
      }
      if (have_all_nodes) {
        if (node_per != size_per)
          nodes[node_per] = (REF_INT)c2n[node_per + size_per * cell];
        one_node_local = REF_FALSE;
        for (node = 0; node < node_per; node++) {
          one_node_local =
              (one_node_local || ref_node_owned(ref_node, nodes[node]));
        }
        if (one_node_local)
          RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");
      }
    }

    ncell_read += section_size;
  }

  free(c2n_long);
  free(c2n_int);
  free(c2n);

  return REF_SUCCESS;
}